

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

TypeBase * GetBaseType(ExpressionContext *ctx,VmType type)

{
  bool bVar1;
  ExpressionContext *ctx_local;
  VmType type_local;
  
  type_local._0_8_ = type.structType;
  ctx_local = type._0_8_;
  bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Void);
  if (bVar1) {
    type_local.structType = ctx->typeVoid;
  }
  else {
    bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Int);
    if (bVar1) {
      type_local.structType = ctx->typeInt;
    }
    else {
      bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Double);
      if (bVar1) {
        type_local.structType = ctx->typeDouble;
      }
      else {
        bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Long);
        if (bVar1) {
          type_local.structType = ctx->typeLong;
        }
        else if ((int)ctx_local == 6) {
          type_local.structType = (TypeBase *)type_local._0_8_;
        }
        else if ((int)ctx_local == 7) {
          type_local.structType = (TypeBase *)type_local._0_8_;
        }
        else if ((int)ctx_local == 8) {
          type_local.structType = (TypeBase *)type_local._0_8_;
        }
        else {
          bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::AutoRef);
          if (bVar1) {
            type_local.structType = &ctx->typeAutoRef->super_TypeBase;
          }
          else {
            bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::AutoArray);
            if (bVar1) {
              type_local.structType = &ctx->typeAutoArray->super_TypeBase;
            }
            else {
              if ((int)ctx_local != 0xb) {
                __assert_fail("!\"unknown type\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                              ,0x246,"TypeBase *GetBaseType(ExpressionContext &, VmType)");
              }
              type_local.structType = (TypeBase *)type_local._0_8_;
            }
          }
        }
      }
    }
  }
  return type_local.structType;
}

Assistant:

TypeBase* GetBaseType(ExpressionContext &ctx, VmType type)
{
	if(type == VmType::Void)
		return ctx.typeVoid;
	else if(type == VmType::Int)
		return ctx.typeInt;
	else if(type == VmType::Double)
		return ctx.typeDouble;
	else if(type == VmType::Long)
		return ctx.typeLong;
	else if(type.type == VM_TYPE_POINTER)
		return type.structType;
	else if(type.type == VM_TYPE_FUNCTION_REF)
		return type.structType;
	else if(type.type == VM_TYPE_ARRAY_REF)
		return type.structType;
	else if(type == VmType::AutoRef)
		return ctx.typeAutoRef;
	else if(type == VmType::AutoArray)
		return ctx.typeAutoArray;
	else if(type.type == VM_TYPE_STRUCT)
		return type.structType;
	else
		assert(!"unknown type");

	return NULL;
}